

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgvalfmt.c
# Opt level: O1

int mpt_msgvalfmt_typeid(uint8_t fmt)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ulong len;
  
  if (-1 < (char)fmt) {
    return -2;
  }
  bVar2 = fmt & 0x7f;
  uVar1 = (uint)bVar2 * 0x40 + 0x40;
  if (0x1f < bVar2) {
    uVar1 = (bVar2 & 0x1f) + 1;
  }
  len = (ulong)uVar1;
  uVar3 = 0xfffffffd;
  switch(fmt >> 5 & 3) {
  case 0:
    goto switchD_00115440_caseD_0;
  case 1:
    bVar2 = mpt_type_uint(len);
    break;
  case 2:
    if (len == 4) {
      return 0x66;
    }
    if (uVar1 != 0x10) {
      if (uVar1 != 8) {
        return -3;
      }
      return 100;
    }
    return 0x65;
  case 3:
    bVar2 = mpt_type_int(len);
  }
  uVar3 = 0xfffffffd;
  if (bVar2 != 0) {
    uVar3 = (uint)bVar2;
  }
switchD_00115440_caseD_0:
  return uVar3;
}

Assistant:

extern int mpt_msgvalfmt_typeid(uint8_t fmt)
{
	ssize_t size;
	/* value in wrong byte order */
	if ((fmt & MPT_MESGVAL(ByteOrderLittle)) != MPT_MESGVAL(ByteOrderNative)) {
		return MPT_ERROR(BadValue);
	}
	size = mpt_msgvalfmt_size(fmt);
	
	switch (fmt & MPT_MESGVAL(Normal)) {
	  /* no representation for big numbers */
	  case 0:
		return MPT_ERROR(BadType);
	  case MPT_MESGVAL(Integer):
		fmt = mpt_type_int(size);
		break;
	  case MPT_MESGVAL(Float):
		switch (size) {
		  case sizeof(float): return 'f';
		  case sizeof(double): return 'd';
		  case sizeof(long double): return 'e';
		  default: return MPT_ERROR(BadType);
		}
	  case MPT_MESGVAL(Unsigned):
		fmt = mpt_type_uint(size);
		break;
	}
	return fmt ? fmt : MPT_ERROR(BadType);
}